

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall RleTaskScheduler::process(RleTaskScheduler *this,VTask *task)

{
  bool bVar1;
  __int_type_conflict _Var2;
  TaskQueue<std::shared_ptr<VRleTask>_> *in_RSI;
  TaskQueue<std::shared_ptr<VRleTask>_> *in_RDI;
  uint n;
  __int_type_conflict i;
  int iVar3;
  TaskQueue<std::shared_ptr<VRleTask>_> *this_00;
  
  this_00 = in_RDI;
  _Var2 = std::__atomic_base<unsigned_int>::operator++
                    ((__atomic_base<unsigned_int> *)
                     &(in_RDI->_q).
                      super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first,0);
  iVar3 = 0;
  while( true ) {
    if (iVar3 == *(int *)&(in_RDI->_q).
                          super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                          ._M_impl.super__Deque_impl_data._M_map) {
      if (*(int *)&(in_RDI->_q).
                   super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                   ._M_impl.super__Deque_impl_data._M_map != 0) {
        std::
        vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
        ::operator[]((vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                      *)&(in_RDI->_q).
                         super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_last,
                     (ulong)_Var2 %
                     (ulong)*(uint *)&(in_RDI->_q).
                                      super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                                      ._M_impl.super__Deque_impl_data._M_map);
        TaskQueue<std::shared_ptr<VRleTask>_>::push
                  (in_RSI,(shared_ptr<VRleTask> *)CONCAT44(_Var2,iVar3));
      }
      return;
    }
    std::
    vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
    ::operator[]((vector<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                  *)&(in_RDI->_q).
                     super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last,
                 (ulong)(_Var2 + iVar3) %
                 (ulong)*(uint *)&(in_RDI->_q).
                                  super__Deque_base<std::shared_ptr<VRleTask>,_std::allocator<std::shared_ptr<VRleTask>_>_>
                                  ._M_impl.super__Deque_impl_data._M_map);
    bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::try_push(this_00,(shared_ptr<VRleTask> *)in_RSI);
    if (bVar1) break;
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void process(VTask task)
    {
        auto i = _index++;

        for (unsigned n = 0; n != _count; ++n) {
            if (_q[(i + n) % _count].try_push(std::move(task))) return;
        }

        if (_count > 0) {
            _q[i % _count].push(std::move(task));
        }
    }